

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cuboctahedron.cpp
# Opt level: O0

void __thiscall
OpenMD::Cuboctahedron::Cuboctahedron(Cuboctahedron *this,string *lattice,int cells,int planes)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  string *in_RSI;
  undefined8 *in_RDI;
  value_type *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_00;
  double in_stack_fffffffffffffeb8;
  undefined8 *x;
  Vector3<double> *in_stack_fffffffffffffec0;
  Vector3<double> *this_01;
  locale *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  locale local_20 [8];
  undefined4 local_18;
  undefined4 local_14;
  
  *in_RDI = &PTR__Cuboctahedron_0034d9c8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  *(undefined4 *)(in_RDI + 5) = local_14;
  *(undefined4 *)((long)in_RDI + 0x2c) = local_18;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x2b7e86)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x2b7e99)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::clear
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x2b7ea3)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::clear
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x2b7ead)
  ;
  std::locale::locale(local_20);
  toUpper<std::__cxx11::string>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::locale::~locale(local_20);
  bVar1 = std::operator==(in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
  if (bVar1) {
    Vector3<double>::Vector3
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(double)in_stack_fffffffffffffeb0
               ,(double)in_stack_fffffffffffffea8);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    Vector3<double>::Vector3
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(double)in_stack_fffffffffffffeb0
               ,(double)in_stack_fffffffffffffea8);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    if (bVar1) {
      Vector3<double>::Vector3
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (double)in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
    else {
      Vector3<double>::Vector3
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (double)in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      this_01 = (Vector3<double> *)(in_RDI + 9);
      Vector3<double>::Vector3
                (this_01,in_stack_fffffffffffffeb8,(double)in_stack_fffffffffffffeb0,
                 (double)in_stack_fffffffffffffea8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      x = in_RDI + 9;
      Vector3<double>::Vector3
                (this_01,(double)x,(double)in_stack_fffffffffffffeb0,
                 (double)in_stack_fffffffffffffea8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      this_00 = (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                (in_RDI + 9);
      Vector3<double>::Vector3(this_01,(double)x,(double)this_00,(double)in_stack_fffffffffffffea8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                (this_00,in_stack_fffffffffffffea8);
    }
  }
  return;
}

Assistant:

Cuboctahedron::Cuboctahedron(std::string lattice, int cells, int planes) :
      lattice_(lattice), L_(cells), M_(planes) {
    Basis.clear();
    Points.clear();

    //
    // Initialize Basis vectors.
    //
    toUpper(lattice);

    if (lattice == "BCC") {
      Basis.push_back(Vector3d(0.0, 0.0, 0.0));
      Basis.push_back(Vector3d(0.5, 0.5, 0.5));
    } else if (lattice == "SC") {
      Basis.push_back(Vector3d(0.0, 0.0, 0.0));
    } else {
      // Default is FCC:
      Basis.push_back(Vector3d(0.0, 0.0, 0.0));
      Basis.push_back(Vector3d(0.5, 0.5, 0.0));
      Basis.push_back(Vector3d(0.5, 0.0, 0.5));
      Basis.push_back(Vector3d(0.0, 0.5, 0.5));
    }
  }